

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDebug.cpp
# Opt level: O0

void VulkanUtilities::InsertCmdQueueLabel(VkQueue cmdQueue,char *pLabelName,float *color)

{
  int local_4c;
  undefined4 local_48;
  int i;
  VkDebugUtilsLabelEXT Label;
  float *color_local;
  char *pLabelName_local;
  VkQueue cmdQueue_local;
  
  if ((anonymous_namespace)::QueueInsertDebugUtilsLabelEXT != (code *)0x0) {
    Label.color._8_8_ = color;
    memset(&local_48,0,0x28);
    local_48 = 0x3b9cbe02;
    Label.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    Label._4_4_ = 0;
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      Label.color[(long)local_4c + -2] = *(float *)(Label.color._8_8_ + (long)local_4c * 4);
    }
    Label.pNext = pLabelName;
    (*(anonymous_namespace)::QueueInsertDebugUtilsLabelEXT)(cmdQueue,&local_48);
  }
  return;
}

Assistant:

void InsertCmdQueueLabel(VkQueue cmdQueue, const char* pLabelName, const float* color)
{
    if (QueueInsertDebugUtilsLabelEXT == nullptr)
        return;

    VkDebugUtilsLabelEXT Label{};
    Label.sType      = VK_STRUCTURE_TYPE_DEBUG_UTILS_LABEL_EXT;
    Label.pNext      = nullptr;
    Label.pLabelName = pLabelName;
    for (int i = 0; i < 4; ++i)
        Label.color[i] = color[i];
    QueueInsertDebugUtilsLabelEXT(cmdQueue, &Label);
}